

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::CropResizeLayerParams::ByteSizeLong(CropResizeLayerParams *this)

{
  SamplingMode *pSVar1;
  BoxCoordinatesMode *pBVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  unsigned_long *puVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  size_t sVar11;
  
  uVar5 = (this->targetsize_).current_size_;
  uVar8 = 0;
  if ((int)uVar5 < 1) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    do {
      puVar6 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->targetsize_,(int)uVar8);
      lVar4 = 0x3f;
      if ((*puVar6 | 1) != 0) {
        for (; (*puVar6 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      lVar9 = lVar9 + (ulong)((int)lVar4 * 9 + 0x49U >> 6);
      uVar10 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar10;
    } while (uVar5 != uVar10);
    if (lVar9 == 0) {
      lVar9 = 0;
      uVar8 = 0;
    }
    else if ((int)(uint)lVar9 < 0) {
      uVar8 = 0xb;
    }
    else {
      uVar5 = (uint)lVar9 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_targetsize_cached_byte_size_ = (int)lVar9;
  sVar11 = uVar8 + lVar9;
  pSVar1 = this->mode_;
  if (pSVar1 != (SamplingMode *)0x0 &&
      this != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    uVar5 = pSVar1->samplingmethod_;
    if (uVar5 == 0) {
      uVar8 = 0;
    }
    else if ((int)uVar5 < 0) {
      uVar8 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    pSVar1->_cached_size_ = (int)uVar8;
    sVar11 = sVar11 + uVar8 + 2;
  }
  pBVar2 = this->boxindicesmode_;
  if (pBVar2 != (BoxCoordinatesMode *)0x0 &&
      this != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    uVar5 = pBVar2->boxmode_;
    if (uVar5 == 0) {
      uVar8 = 0;
    }
    else if ((int)uVar5 < 0) {
      uVar8 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    pBVar2->_cached_size_ = (int)uVar8;
    sVar11 = sVar11 + uVar8 + 2;
  }
  sVar7 = sVar11 + 2;
  if (this->normalizedcoordinates_ == false) {
    sVar7 = sVar11;
  }
  sVar11 = sVar7;
  if (this->spatialscale_ != 0.0) {
    sVar11 = sVar7 + 5;
  }
  if (NAN(this->spatialscale_)) {
    sVar11 = sVar7 + 5;
  }
  this->_cached_size_ = (int)sVar11;
  return sVar11;
}

Assistant:

size_t CropResizeLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CropResizeLayerParams)
  size_t total_size = 0;

  // repeated uint64 targetSize = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->targetsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _targetsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.SamplingMode mode = 3;
  if (this->has_mode()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->mode_);
  }

  // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
  if (this->has_boxindicesmode()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->boxindicesmode_);
  }

  // bool normalizedCoordinates = 2;
  if (this->normalizedcoordinates() != 0) {
    total_size += 1 + 1;
  }

  // float spatialScale = 5;
  if (this->spatialscale() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}